

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void Curl_dnscache_prune(Curl_easy *data)

{
  bool bVar1;
  Curl_hash *hostcache;
  time_t now_00;
  time_t tVar2;
  size_t sVar3;
  time_t oldest;
  int timeout;
  time_t now;
  Curl_dnscache *dnscache;
  Curl_easy *data_local;
  
  hostcache = &dnscache_get(data)->entries;
  oldest._4_4_ = (data->set).dns_cache_timeout;
  if (hostcache != (Curl_hash *)0x0) {
    dnscache_lock(data,(Curl_dnscache *)hostcache);
    now_00 = time((time_t *)0x0);
    do {
      tVar2 = dnscache_prune(hostcache,oldest._4_4_,now_00);
      if (tVar2 < 0x7fffffff) {
        oldest._4_4_ = (int)tVar2;
      }
      else {
        oldest._4_4_ = 0x7ffffffe;
      }
      bVar1 = false;
      if (oldest._4_4_ != 0) {
        sVar3 = Curl_hash_count(hostcache);
        bVar1 = 29999 < sVar3;
      }
    } while (bVar1);
    dnscache_unlock(data,(Curl_dnscache *)hostcache);
  }
  return;
}

Assistant:

void Curl_dnscache_prune(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  time_t now;
  /* the timeout may be set -1 (forever) */
  int timeout = data->set.dns_cache_timeout;

  if(!dnscache)
    /* NULL hostcache means we cannot do it */
    return;

  dnscache_lock(data, dnscache);

  now = time(NULL);

  do {
    /* Remove outdated and unused entries from the hostcache */
    time_t oldest = dnscache_prune(&dnscache->entries, timeout, now);

    if(oldest < INT_MAX)
      timeout = (int)oldest; /* we know it fits */
    else
      timeout = INT_MAX - 1;

    /* if the cache size is still too big, use the oldest age as new
       prune limit */
  } while(timeout &&
          (Curl_hash_count(&dnscache->entries) > MAX_DNS_CACHE_SIZE));

  dnscache_unlock(data, dnscache);
}